

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkPrintLatch(FILE *pFile,Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int iStack_48;
  int Init;
  int InitNums [4];
  int Counter2;
  int Counter1;
  int Counter0;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pLatch;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                  ,0x203,"void Abc_NtkPrintLatch(FILE *, Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  if (iVar1 == 0) {
    fprintf((FILE *)pFile,"The network is combinational.\n");
  }
  else {
    for (Counter1 = 0; Counter1 < 4; Counter1 = Counter1 + 1) {
      (&iStack_48)[Counter1] = 0;
    }
    InitNums[2] = 0;
    InitNums[3] = 0;
    Counter2 = 0;
    for (Counter1 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), Counter1 < iVar1; Counter1 = Counter1 + 1)
    {
      pAVar4 = Abc_NtkBox(pNtk,Counter1);
      iVar1 = Abc_ObjIsLatch(pAVar4);
      if (iVar1 != 0) {
        iVar1 = Abc_LatchInit(pAVar4);
        if (3 < iVar1) {
          __assert_fail("Init < 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                        ,0x210,"void Abc_NtkPrintLatch(FILE *, Abc_Ntk_t *)");
        }
        (&iStack_48)[iVar1] = (&iStack_48)[iVar1] + 1;
        pAVar5 = Abc_ObjFanin0(pAVar4);
        pAVar5 = Abc_ObjFanin0(pAVar5);
        iVar1 = Abc_NtkIsLogic(pNtk);
        if (iVar1 == 0) {
          iVar1 = Abc_NtkIsStrash(pNtk);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                          ,0x21f,"void Abc_NtkPrintLatch(FILE *, Abc_Ntk_t *)");
          }
          iVar1 = Abc_AigNodeIsConst(pAVar5);
        }
        else {
          iVar1 = Abc_NodeIsConst(pAVar5);
        }
        if (iVar1 != 0) {
          Counter2 = Counter2 + 1;
          iVar1 = Abc_LatchIsInitDc(pAVar4);
          if (iVar1 == 0) {
            iVar1 = Abc_NtkIsStrash(pNtk);
            if (iVar1 == 0) {
              iVar1 = Abc_LatchIsInit1(pAVar4);
              pAVar4 = Abc_ObjFanin0(pAVar4);
              pAVar4 = Abc_ObjFanin0(pAVar4);
              iVar2 = Abc_NodeIsConst1(pAVar4);
              if (iVar1 == iVar2) {
                InitNums[2] = InitNums[2] + 1;
              }
            }
            else {
              uVar3 = Abc_LatchIsInit1(pAVar4);
              iVar1 = Abc_ObjFaninC0(pAVar4);
              if (uVar3 == ((iVar1 != 0 ^ 0xffU) & 1)) {
                InitNums[2] = InitNums[2] + 1;
              }
            }
          }
          else {
            InitNums[3] = InitNums[3] + 1;
          }
        }
      }
    }
    uVar3 = Abc_NtkLatchNum(pNtk);
    fprintf((FILE *)pFile,
            "Total latches = %5d. Init0 = %d. Init1 = %d. InitDC = %d. Const data = %d.\n",
            (ulong)uVar3,(ulong)(uint)Init,(ulong)(uint)InitNums[0],(ulong)(uint)InitNums[1],
            Counter2);
  }
  return;
}

Assistant:

void Abc_NtkPrintLatch( FILE * pFile, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pLatch, * pFanin;
    int i, Counter0, Counter1, Counter2;
    int InitNums[4], Init;

    assert( !Abc_NtkIsNetlist(pNtk) );
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        fprintf( pFile, "The network is combinational.\n" );
        return;
    }

    for ( i = 0; i < 4; i++ )
        InitNums[i] = 0;
    Counter0 = Counter1 = Counter2 = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        Init = Abc_LatchInit( pLatch );
        assert( Init < 4 );
        InitNums[Init]++;

        pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pLatch));
        if ( Abc_NtkIsLogic(pNtk) )
        {
            if ( !Abc_NodeIsConst(pFanin) )
                continue;
        }
        else if ( Abc_NtkIsStrash(pNtk) )
        {
            if ( !Abc_AigNodeIsConst(pFanin) )
                continue;
        }
        else
            assert( 0 );

        // the latch input is a constant node
        Counter0++;
        if ( Abc_LatchIsInitDc(pLatch) )
        {
            Counter1++;
            continue;
        }
        // count the number of cases when the constant is equal to the initial value
        if ( Abc_NtkIsStrash(pNtk) )
        {
            if ( Abc_LatchIsInit1(pLatch) == !Abc_ObjFaninC0(pLatch) )
                Counter2++;
        }
        else
        {
            if ( Abc_LatchIsInit1(pLatch) == Abc_NodeIsConst1(Abc_ObjFanin0(Abc_ObjFanin0(pLatch))) )
                Counter2++;
        }
    }
//    fprintf( pFile, "%-15s:  ", pNtk->pName );
    fprintf( pFile, "Total latches = %5d. Init0 = %d. Init1 = %d. InitDC = %d. Const data = %d.\n",
        Abc_NtkLatchNum(pNtk), InitNums[1], InitNums[2], InitNums[3], Counter0 );
//    fprintf( pFile, "Const fanin = %3d. DC init = %3d. Matching init = %3d. ", Counter0, Counter1, Counter2 );
//    fprintf( pFile, "Self-feed latches = %2d.\n", -1 ); //Abc_NtkCountSelfFeedLatches(pNtk) );
}